

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O1

bool __thiscall BamTools::ConvertTool::ConvertToolPrivate::Run(ConvertToolPrivate *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConvertSettings *pCVar2;
  size_t sVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  __type _Var8;
  int iVar9;
  string *psVar10;
  istream *piVar11;
  ostream *poVar12;
  long lVar13;
  char *pcVar14;
  code *pcVar15;
  BamMultiReader reader;
  ofstream outFile;
  string line;
  BamMultiReader local_3b0;
  BamRegion local_3a8;
  undefined1 local_390 [32];
  byte abStack_370 [216];
  ios_base local_298 [272];
  BamAlignment local_188;
  
  pCVar2 = this->m_settings;
  if ((pCVar2->HasInput == false) && (pCVar2->HasInputFilelist == false)) {
    psVar10 = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pCVar2->InputFiles,psVar10);
  }
  if (this->m_settings->HasInputFilelist == true) {
    std::ifstream::ifstream
              ((istream *)local_390,(this->m_settings->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar5 = std::__basic_file<char>::is_open();
    if (cVar5 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "bamtools convert ERROR: could not open input BAM file list... Aborting.",0x47);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    else {
      paVar1 = &local_188.Name.field_2;
      local_188.Name._M_string_length = 0;
      local_188.Name.field_2._M_local_buf[0] = '\0';
      local_188.Name._M_dataplus._M_p = (pointer)paVar1;
      while( true ) {
        cVar6 = std::ios::widen((char)(((pointer)(local_390._0_8_ + -0x28))->RefName).field_2.
                                      _M_allocated_capacity + (char)(istream *)local_390);
        piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_390,(string *)&local_188,cVar6);
        if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_settings->InputFiles,&local_188.Name);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.Name._M_dataplus._M_p != paVar1) {
        operator_delete(local_188.Name._M_dataplus._M_p);
      }
    }
    std::ifstream::~ifstream(local_390);
    if (cVar5 == '\0') {
      return false;
    }
  }
  BamMultiReader::BamMultiReader(&local_3b0);
  bVar7 = BamMultiReader::Open(&local_3b0,&this->m_settings->InputFiles);
  if (bVar7) {
    if ((this->m_settings->HasInput == true) && (this->m_settings->HasRegion == true)) {
      local_390._0_4_ = 1;
      bVar7 = BamMultiReader::LocateIndexes(&local_3b0,(IndexType *)local_390);
      if (!bVar7) {
        lVar13 = 0x43;
        pcVar14 = "bamtools convert ERROR: could not locate index file(s)... Aborting.";
        goto LAB_00150f35;
      }
    }
    BamMultiReader::GetReferenceData((RefVector *)local_390,&local_3b0);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::operator=
              (&this->m_references,
               (vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)local_390);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector
              ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)local_390);
    local_3a8.LeftRefID = -1;
    local_3a8.LeftPosition = -1;
    local_3a8.RightRefID = -1;
    local_3a8.RightPosition = -1;
    if (this->m_settings->HasRegion != true) {
LAB_00150e76:
      std::ofstream::ofstream(local_390);
      if (this->m_settings->HasOutput == true) {
        std::ofstream::open(local_390,
                            (_Ios_Openmode)(this->m_settings->OutputFilename)._M_dataplus._M_p);
        if ((abStack_370
             [(((pointer)(local_390._0_8_ + -0x28))->RefName).field_2._M_allocated_capacity] & 5) ==
            0) {
          std::ios::rdbuf((streambuf *)(&this->m_out + *(long *)(*(long *)&this->m_out + -0x18)));
          goto LAB_00151016;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"bamtools convert ERROR: could not open ",0x27);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             (this->m_settings->OutputFilename)._M_dataplus._M_p,
                             (this->m_settings->OutputFilename)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," for output",0xb);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        bVar7 = false;
      }
      else {
LAB_00151016:
        sVar3 = (this->m_settings->Format)._M_string_length;
        psVar10 = &this->m_settings->Format;
        if ((sVar3 == DAT_001f46a0) &&
           ((sVar3 == 0 ||
            (iVar9 = bcmp((psVar10->_M_dataplus)._M_p,FORMAT_PILEUP_abi_cxx11_,sVar3), iVar9 == 0)))
           ) {
          bVar7 = RunPileupConversion(this,&local_3b0);
        }
        else {
          if ((((sVar3 == DAT_001f4600) &&
               ((pcVar15 = PrintBed, sVar3 == 0 ||
                (iVar9 = bcmp((psVar10->_M_dataplus)._M_p,FORMAT_BED_abi_cxx11_,sVar3), iVar9 == 0))
               )) || ((sVar3 == DAT_001f4620 &&
                      ((pcVar15 = PrintFasta, sVar3 == 0 ||
                       (iVar9 = bcmp((psVar10->_M_dataplus)._M_p,FORMAT_FASTA_abi_cxx11_,sVar3),
                       iVar9 == 0)))))) ||
             ((sVar3 == DAT_001f4640 &&
              ((pcVar15 = PrintFastq, sVar3 == 0 ||
               (iVar9 = bcmp((psVar10->_M_dataplus)._M_p,FORMAT_FASTQ_abi_cxx11_,sVar3), iVar9 == 0)
               ))))) {
LAB_001511bd:
            bVar7 = true;
            bVar4 = false;
          }
          else {
            _Var8 = std::operator==(psVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)FORMAT_JSON_abi_cxx11_);
            if (_Var8) {
              pcVar15 = PrintJson;
              goto LAB_001511bd;
            }
            _Var8 = std::operator==(&this->m_settings->Format,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&FORMAT_SAM_abi_cxx11_);
            if (_Var8) {
              pcVar15 = PrintSam;
              goto LAB_001511bd;
            }
            _Var8 = std::operator==(&this->m_settings->Format,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)FORMAT_YAML_abi_cxx11_);
            if (_Var8) {
              pcVar15 = PrintYaml;
              goto LAB_001511bd;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"bamtools convert ERROR: unrecognized format: ",0x2d);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(this->m_settings->Format)._M_dataplus._M_p,
                                 (this->m_settings->Format)._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "Please see documentation for list of supported formats ",0x37);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            bVar4 = true;
            bVar7 = false;
            pcVar15 = (code *)0x0;
          }
          if (!bVar4) {
            pCVar2 = this->m_settings;
            sVar3 = (pCVar2->Format)._M_string_length;
            if ((sVar3 == DAT_001f4680) &&
               (((sVar3 == 0 ||
                 (iVar9 = bcmp((pCVar2->Format)._M_dataplus._M_p,FORMAT_SAM_abi_cxx11_,sVar3),
                 iVar9 == 0)) && (pCVar2->IsOmittingSamHeader == false)))) {
              BamMultiReader::GetHeaderText_abi_cxx11_(&local_188.Name,&local_3b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&this->m_out,local_188.Name._M_dataplus._M_p,
                         local_188.Name._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188.Name._M_dataplus._M_p != &local_188.Name.field_2) {
                operator_delete(local_188.Name._M_dataplus._M_p);
              }
            }
            BamAlignment::BamAlignment(&local_188);
            while (bVar7 = BamMultiReader::GetNextAlignment(&local_3b0,&local_188), bVar7) {
              (*pcVar15)(this,&local_188);
            }
            BamAlignment::~BamAlignment(&local_188);
            bVar7 = true;
          }
        }
        BamMultiReader::Close(&local_3b0);
        if (this->m_settings->HasOutput == true) {
          std::ofstream::close();
        }
      }
      local_390._0_8_ = _VTT;
      *(undefined8 *)(local_390 + _VTT[-1].RefName.field_2._M_allocated_capacity) = _inflate;
      std::filebuf::~filebuf((filebuf *)(local_390 + 8));
      std::ios_base::~ios_base(local_298);
      goto LAB_001512cb;
    }
    bVar7 = Utilities::ParseRegionString(&this->m_settings->Region,&local_3b0,&local_3a8);
    if (bVar7) {
      bVar7 = BamMultiReader::HasIndexes(&local_3b0);
      if ((!bVar7) || (bVar7 = BamMultiReader::SetRegion(&local_3b0,&local_3a8), bVar7))
      goto LAB_00150e76;
      lVar13 = 0x54;
      pcVar14 = 
      "bamtools convert ERROR: set region failed. Check that REGION describes a valid range";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"bamtools convert ERROR: could not parse REGION: ",0x30);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(this->m_settings->Region)._M_dataplus._M_p,
                           (this->m_settings->Region)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      lVar13 = 0x5b;
      pcVar14 = 
      "Check that REGION is in valid format (see documentation) and that the coordinates are valid";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,lVar13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    BamMultiReader::Close(&local_3b0);
  }
  else {
    lVar13 = 0x45;
    pcVar14 = "bamtools convert ERROR: could not open input BAM file(s)... Aborting.";
LAB_00150f35:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar14,lVar13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  bVar7 = false;
LAB_001512cb:
  BamMultiReader::~BamMultiReader(&local_3b0);
  return bVar7;
}

Assistant:

bool ConvertTool::ConvertToolPrivate::Run()
{

    // ------------------------------------
    // initialize conversion input/output

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist)
        m_settings->InputFiles.push_back(Options::StandardIn());

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools convert ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line))
            m_settings->InputFiles.push_back(line);
    }

    // open input files
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools convert ERROR: could not open input BAM file(s)... Aborting."
                  << std::endl;
        return false;
    }

    // if input is not stdin & a region is provided, look for index files
    if (m_settings->HasInput && m_settings->HasRegion) {
        if (!reader.LocateIndexes()) {
            std::cerr << "bamtools convert ERROR: could not locate index file(s)... Aborting."
                      << std::endl;
            return false;
        }
    }

    // retrieve reference data
    m_references = reader.GetReferenceData();

    // set region if specified
    BamRegion region;
    if (m_settings->HasRegion) {
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            if (reader.HasIndexes()) {
                if (!reader.SetRegion(region)) {
                    std::cerr << "bamtools convert ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }
            }

        } else {
            std::cerr << "bamtools convert ERROR: could not parse REGION: " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            return false;
        }
    }

    // if output file given
    std::ofstream outFile;
    if (m_settings->HasOutput) {

        // open output file stream
        outFile.open(m_settings->OutputFilename.c_str());
        if (!outFile) {
            std::cerr << "bamtools convert ERROR: could not open " << m_settings->OutputFilename
                      << " for output" << std::endl;
            return false;
        }

        // set m_out to file's streambuf
        m_out.rdbuf(outFile.rdbuf());
    }

    // -------------------------------------
    // do conversion based on format

    bool convertedOk = true;

    // pileup is special case
    // conversion not done per alignment, like the other formats
    if (m_settings->Format == FORMAT_PILEUP) convertedOk = RunPileupConversion(&reader);

    // all other formats
    else {

        bool formatError = false;

        // set function pointer to proper conversion method
        void (BamTools::ConvertTool::ConvertToolPrivate::*pFunction)(const BamAlignment&) = 0;
        if (m_settings->Format == FORMAT_BED)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintBed;
        else if (m_settings->Format == FORMAT_FASTA)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFasta;
        else if (m_settings->Format == FORMAT_FASTQ)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintFastq;
        else if (m_settings->Format == FORMAT_JSON)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintJson;
        else if (m_settings->Format == FORMAT_SAM)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintSam;
        else if (m_settings->Format == FORMAT_YAML)
            pFunction = &BamTools::ConvertTool::ConvertToolPrivate::PrintYaml;
        else {
            std::cerr << "bamtools convert ERROR: unrecognized format: " << m_settings->Format
                      << std::endl;
            std::cerr << "Please see documentation for list of supported formats " << std::endl;
            formatError = true;
            convertedOk = false;
        }

        // if format selected ok
        if (!formatError) {

            // if SAM format & not omitting header, print SAM header first
            if ((m_settings->Format == FORMAT_SAM) && !m_settings->IsOmittingSamHeader)
                m_out << reader.GetHeaderText();

            // iterate through file, doing conversion
            BamAlignment a;
            while (reader.GetNextAlignment(a))
                (this->*pFunction)(a);

            // set flag for successful conversion
            convertedOk = true;
        }
    }

    // ------------------------
    // clean up & exit
    reader.Close();
    if (m_settings->HasOutput) outFile.close();
    return convertedOk;
}